

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O0

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::sort_cells(rasterizer_cells_aa<agg::cell_aa> *this)

{
  int iVar1;
  uint uVar2;
  sorted_y *psVar3;
  cell_aa **ppcVar4;
  int *piVar5;
  uint local_58;
  uint local_4c;
  sorted_y *curr_y_1;
  sorted_y *curr_y;
  uint v;
  uint start;
  uint i;
  uint nb;
  cell_type *cell_ptr;
  cell_type **block_ptr;
  rasterizer_cells_aa<agg::cell_aa> *this_local;
  
  if ((this->m_sorted & 1U) == 0) {
    add_curr_cell(this);
    iVar1 = std::numeric_limits<int>::max();
    (this->m_curr_cell).x = iVar1;
    iVar1 = std::numeric_limits<int>::max();
    (this->m_curr_cell).y = iVar1;
    (this->m_curr_cell).cover = 0;
    (this->m_curr_cell).area = 0;
    if (this->m_num_cells != 0) {
      pod_vector<agg::cell_aa_*>::allocate(&this->m_sorted_cells,this->m_num_cells,0x10);
      pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::allocate
                (&this->m_sorted_y,(this->m_max_y - this->m_min_y) + 1,0x10);
      pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::zero(&this->m_sorted_y);
      start = this->m_num_cells;
      cell_ptr = (cell_type *)this->m_cells;
      while (start != 0) {
        piVar5 = &cell_ptr->cover;
        i = cell_ptr->x;
        unique0x00012004 = cell_ptr->y;
        if (start < 0x1001) {
          local_4c = start;
        }
        else {
          local_4c = 0x1000;
        }
        v = local_4c;
        start = start - local_4c;
        while (cell_ptr = (cell_type *)piVar5, v != 0) {
          psVar3 = pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::operator[]
                             (&this->m_sorted_y,*(int *)((long)_i + 4) - this->m_min_y);
          psVar3->start = psVar3->start + 1;
          _i = (cell_aa *)((long)_i + 0x10);
          v = v - 1;
        }
      }
      curr_y._4_4_ = 0;
      for (v = 0; uVar2 = pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::size
                                    (&this->m_sorted_y), v < uVar2; v = v + 1) {
        psVar3 = pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::operator[]
                           (&this->m_sorted_y,v);
        uVar2 = psVar3->start;
        psVar3 = pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::operator[]
                           (&this->m_sorted_y,v);
        psVar3->start = curr_y._4_4_;
        curr_y._4_4_ = uVar2 + curr_y._4_4_;
      }
      start = this->m_num_cells;
      cell_ptr = (cell_type *)this->m_cells;
      while (start != 0) {
        piVar5 = &cell_ptr->cover;
        _i = *(cell_aa **)cell_ptr;
        if (start < 0x1001) {
          local_58 = start;
        }
        else {
          local_58 = 0x1000;
        }
        v = local_58;
        start = start - local_58;
        while (cell_ptr = (cell_type *)piVar5, v != 0) {
          psVar3 = pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::operator[]
                             (&this->m_sorted_y,_i->y - this->m_min_y);
          ppcVar4 = pod_vector<agg::cell_aa_*>::operator[]
                              (&this->m_sorted_cells,psVar3->start + psVar3->num);
          *ppcVar4 = _i;
          psVar3->num = psVar3->num + 1;
          _i = _i + 1;
          v = v - 1;
        }
      }
      for (v = 0; uVar2 = pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::size
                                    (&this->m_sorted_y), v < uVar2; v = v + 1) {
        psVar3 = pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::operator[]
                           (&this->m_sorted_y,v);
        if (psVar3->num != 0) {
          ppcVar4 = pod_vector<agg::cell_aa_*>::data(&this->m_sorted_cells);
          qsort_cells<agg::cell_aa>(ppcVar4 + psVar3->start,psVar3->num);
        }
      }
      this->m_sorted = true;
    }
  }
  return;
}

Assistant:

void rasterizer_cells_aa<Cell>::sort_cells()
    {
        if(m_sorted) return; //Perform sort only the first time.

        add_curr_cell();
        m_curr_cell.x     = std::numeric_limits<int>::max();
        m_curr_cell.y     = std::numeric_limits<int>::max();
        m_curr_cell.cover = 0;
        m_curr_cell.area  = 0;

        if(m_num_cells == 0) return;

// DBG: Check to see if min/max works well.
//for(unsigned nc = 0; nc < m_num_cells; nc++)
//{
//    cell_type* cell = m_cells[nc >> cell_block_shift] + (nc & cell_block_mask);
//    if(cell->x < m_min_x || 
//       cell->y < m_min_y || 
//       cell->x > m_max_x || 
//       cell->y > m_max_y)
//    {
//        cell = cell; // Breakpoint here
//    }
//}
        // Allocate the array of cell pointers
        m_sorted_cells.allocate(m_num_cells, 16);

        // Allocate and zero the Y array
        m_sorted_y.allocate(m_max_y - m_min_y + 1, 16);
        m_sorted_y.zero();

        // Create the Y-histogram (count the numbers of cells for each Y)
        cell_type** block_ptr = m_cells;
        cell_type*  cell_ptr;
        unsigned nb = m_num_cells;
        unsigned i;
        while(nb)
        {
            cell_ptr = *block_ptr++;
            i = (nb > cell_block_size) ? unsigned(cell_block_size) : nb;
            nb -= i;
            while(i--) 
            {
                m_sorted_y[cell_ptr->y - m_min_y].start++;
                ++cell_ptr;
            }
        }

        // Convert the Y-histogram into the array of starting indexes
        unsigned start = 0;
        for(i = 0; i < m_sorted_y.size(); i++)
        {
            unsigned v = m_sorted_y[i].start;
            m_sorted_y[i].start = start;
            start += v;
        }

        // Fill the cell pointer array sorted by Y
        block_ptr = m_cells;
        nb = m_num_cells;
        while(nb)
        {
            cell_ptr = *block_ptr++;
            i = (nb > cell_block_size) ? unsigned(cell_block_size) : nb;
            nb -= i;
            while(i--)
            {
                sorted_y& curr_y = m_sorted_y[cell_ptr->y - m_min_y];
                m_sorted_cells[curr_y.start + curr_y.num] = cell_ptr;
                ++curr_y.num;
                ++cell_ptr;
            }
        }
        
        // Finally arrange the X-arrays
        for(i = 0; i < m_sorted_y.size(); i++)
        {
            const sorted_y& curr_y = m_sorted_y[i];
            if(curr_y.num)
            {
                qsort_cells(m_sorted_cells.data() + curr_y.start, curr_y.num);
            }
        }
        m_sorted = true;
    }